

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.h
# Opt level: O2

void __thiscall NaPNFill::~NaPNFill(NaPNFill *this)

{
  *(code **)this = NaPNQueueOutput::NaPNQueueOutput;
  NaVector::~NaVector((NaVector *)(this + 0x198));
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0x110));
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x48));
  NaPetriNode::~NaPetriNode((NaPetriNode *)this);
  return;
}

Assistant:

class PNNA_API NaPNFill : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNFill (const char* szNodeName = "fill");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	in;

  // Output (mainstream)
  NaPetriCnOutput	out;

  // Synchronize other nodes (-1 while filling and +1 another time)
  NaPetriCnOutput	sync;


  ///////////////////
  // Quick linkage //
  ///////////////////

  // Return mainstream output connector (the only output or NULL)
  virtual NaPetriConnector*	main_output_cn ();


  ///////////////////
  // Node specific //
  ///////////////////

  // Set number of data portions to fill (zeros by default)
  void		set_fill_number (unsigned n);
  void		set_fill_number (unsigned n, NaVector& vect);


  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 2. Link connectors inside the node
  virtual void	relate_connectors ();

  // 5. Verification to be sure all is OK (true)
  virtual bool	verify ();

  // 7. Do one step of node activity and return true if succeeded
  virtual bool	activate ();

  // 8. True action of the node (if activate returned true)
  virtual void	action ();

  // 9. Finish data processing by the node (if activate returned true)
  virtual void	post_action ();

private:

  // Number of samples to skip
  unsigned	nFill;

  // Value to fill output with
  NaVector	vFill;

}